

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  ulong uVar1;
  byte bVar2;
  sqlite3_vfs *psVar3;
  char **ppcVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  void *pvVar9;
  _func_void *p_Var10;
  ulong uVar11;
  byte *pbVar12;
  void **__s;
  uint uVar13;
  u64 uVar14;
  int rc;
  long lVar15;
  uint uVar16;
  char *zErrmsg;
  char *local_58;
  sqlite3 *local_50;
  char **local_48;
  char *local_40;
  size_t local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar3 = db->pVfs;
  local_58 = (char *)0x0;
  sVar7 = strlen(zFile);
  if (pzErrMsg != (char **)0x0) {
    *pzErrMsg = (char *)0x0;
  }
  if ((db->flags & 0x10000) == 0) {
    rc = 1;
    bVar5 = true;
    if (pzErrMsg != (char **)0x0) {
      pcVar8 = sqlite3_mprintf("not authorized");
      *pzErrMsg = pcVar8;
    }
  }
  else {
    local_40 = "sqlite3_extension_init";
    if (zProc != (char *)0x0) {
      local_40 = zProc;
    }
    if (sVar7 < 0x1001) {
      local_50 = db;
      local_48 = pzErrMsg;
      local_38 = sVar7;
      pvVar9 = (*psVar3->xDlOpen)(psVar3,zFile);
      bVar5 = true;
      do {
        if ((!bVar5) || (pvVar9 != (void *)0x0)) {
          sVar7 = local_38;
          pzErrMsg = local_48;
          db = local_50;
          if (pvVar9 == (void *)0x0) goto LAB_0013dafa;
          p_Var10 = (*psVar3->xDlSym)(psVar3,pvVar9,local_40);
          uVar16 = 0;
          if (zProc != (char *)0x0 || p_Var10 != (_func_void *)0x0) {
            pcVar8 = (char *)0x0;
            db = local_50;
            goto LAB_0013dd56;
          }
          if (zFile != (char *)0x0) {
            sVar7 = strlen(zFile);
            uVar16 = (uint)sVar7 & 0x3fffffff;
          }
          iVar6 = sqlite3_initialize();
          if (iVar6 == 0) {
            pcVar8 = (char *)sqlite3Malloc((ulong)(uVar16 + 0x1e));
          }
          else {
            pcVar8 = (char *)0x0;
          }
          if (pcVar8 != (char *)0x0) {
            builtin_strncpy(pcVar8,"sqlite3_",8);
            uVar11 = (ulong)uVar16;
            goto LAB_0013dc88;
          }
          (*psVar3->xDlClose)(psVar3,pvVar9);
          p_Var10 = (_func_void *)0x0;
          db = local_50;
          goto LAB_0013dd4d;
        }
        pcVar8 = sqlite3_mprintf("%s.%s",zFile,"so");
        if (pcVar8 == (char *)0x0) {
          pvVar9 = (void *)0x0;
        }
        else {
          pvVar9 = (*psVar3->xDlOpen)(psVar3,pcVar8);
          sqlite3_free(pcVar8);
        }
        bVar5 = false;
      } while (pcVar8 != (char *)0x0);
      rc = 7;
      bVar5 = true;
      db = local_50;
    }
    else {
LAB_0013dafa:
      rc = 1;
      bVar5 = true;
      if (pzErrMsg != (char **)0x0) {
        local_38 = sVar7;
        iVar6 = sqlite3_initialize();
        if (iVar6 == 0) {
          local_58 = (char *)sqlite3Malloc(sVar7 + 300);
        }
        else {
          local_58 = (char *)0x0;
        }
        *pzErrMsg = local_58;
        if (local_58 != (char *)0x0) {
          sqlite3_snprintf((int)(sVar7 + 300),local_58,"unable to open shared library [%.*s]",0x1000
                           ,zFile);
          (*psVar3->xDlError)(psVar3,(int)local_38 + 299,local_58);
        }
      }
    }
  }
  goto LAB_0013def0;
  while (uVar1 = uVar11 - 1, lVar15 = uVar11 - 1, uVar11 = uVar1, zFile[lVar15] != '/') {
LAB_0013dc88:
    if ((long)uVar11 < 1) {
      uVar16 = 0;
      goto LAB_0013dcb9;
    }
  }
  uVar16 = (int)uVar1 + 1;
LAB_0013dcb9:
  iVar6 = sqlite3_strnicmp(zFile + uVar16,"lib",3);
  db = local_50;
  uVar13 = uVar16 + 3;
  if (iVar6 != 0) {
    uVar13 = uVar16;
  }
  iVar6 = 8;
  for (pbVar12 = (byte *)(zFile + (int)uVar13); (bVar2 = *pbVar12, bVar2 != 0 && (bVar2 != 0x2e));
      pbVar12 = pbVar12 + 1) {
    if ((""[bVar2] & 2) != 0) {
      lVar15 = (long)iVar6;
      iVar6 = iVar6 + 1;
      pcVar8[lVar15] = ""[(uint)(int)(char)bVar2];
    }
  }
  (pcVar8 + (long)iVar6 + 4)[0] = 't';
  (pcVar8 + (long)iVar6 + 4)[1] = '\0';
  builtin_strncpy(pcVar8 + iVar6,"_ini",4);
  p_Var10 = (*psVar3->xDlSym)(psVar3,pvVar9,pcVar8);
  local_40 = pcVar8;
LAB_0013dd4d:
  if (pcVar8 == (char *)0x0) {
LAB_0013de88:
    rc = 7;
  }
  else {
LAB_0013dd56:
    if (p_Var10 == (_func_void *)0x0) {
      if (local_48 != (char **)0x0) {
        sVar7 = strlen(local_40);
        uVar14 = local_38 + sVar7 + 300;
        iVar6 = sqlite3_initialize();
        if (iVar6 == 0) {
          local_58 = (char *)sqlite3Malloc(uVar14);
        }
        else {
          local_58 = (char *)0x0;
        }
        *local_48 = local_58;
        if (local_58 != (char *)0x0) {
          iVar6 = (int)uVar14;
          sqlite3_snprintf(iVar6,local_58,"no entry point [%s] in shared library [%s]",local_40,
                           zFile);
          (*psVar3->xDlError)(psVar3,iVar6 + -1,local_58);
        }
      }
      (*psVar3->xDlClose)(psVar3,pvVar9);
      sqlite3_free(pcVar8);
    }
    else {
      sqlite3_free(pcVar8);
      iVar6 = (*p_Var10)(db,&local_58,&sqlite3Apis);
      ppcVar4 = local_48;
      if (iVar6 == 0) {
        uVar14 = (long)db->nExtension * 8 + 8;
        __s = (void **)sqlite3DbMallocRawNN(db,uVar14);
        if (__s != (void **)0x0) {
          memset(__s,0,uVar14);
          if (0 < (long)db->nExtension) {
            memcpy(__s,db->aExtension,(long)db->nExtension << 3);
          }
          if (db->aExtension != (void **)0x0) {
            sqlite3DbFreeNN(db,db->aExtension);
          }
          db->aExtension = __s;
          iVar6 = db->nExtension;
          db->nExtension = iVar6 + 1;
          __s[iVar6] = pvVar9;
          bVar5 = false;
          rc = 0;
          goto LAB_0013def0;
        }
        goto LAB_0013de88;
      }
      bVar5 = false;
      rc = 0;
      if (iVar6 == 0x100) goto LAB_0013def0;
      if (local_48 != (char **)0x0) {
        pcVar8 = sqlite3_mprintf("error during initialization: %s",local_58);
        *ppcVar4 = pcVar8;
      }
      sqlite3_free(local_58);
      (*psVar3->xDlClose)(psVar3,pvVar9);
    }
    rc = 1;
  }
  bVar5 = true;
LAB_0013def0:
  if ((bVar5) || (iVar6 = 0, db->mallocFailed != '\0')) {
    iVar6 = apiHandleError(db,rc);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar6;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}